

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCEncoder.h
# Opt level: O1

int32_t __thiscall gnilk::IPCBinaryEncoder::WriteStr(IPCBinaryEncoder *this,string *value)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (*(this->super_IPCEncoderBase).super_IPCWriter._vptr_IPCWriter[0xc])
                    (this,(ulong)(ushort)value->_M_string_length);
  iVar2 = (**(this->super_IPCEncoderBase).super_IPCWriter._vptr_IPCWriter)
                    (this,(value->_M_dataplus)._M_p,value->_M_string_length);
  return iVar2 + iVar1;
}

Assistant:

__inline int32_t WriteStr(const std::string &value) override {
            auto ret = WriteU16(value.size());
            ret += Write(value.data(), value.size());
            return ret;
        }